

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

int cmcmd_cmake_ninja_depends(const_iterator argBeg,const_iterator argEnd)

{
  bool bVar1;
  ulong uVar2;
  cmSourceInfo *pcVar3;
  ostream *poVar4;
  string_view sVar5;
  cmAlphaNum local_8a0;
  cmAlphaNum local_870;
  string local_840;
  string local_820;
  string *local_800;
  string *include;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  undefined1 local_7c0 [8];
  cmGeneratedFileStream depfile;
  cmAlphaNum local_528;
  string local_4f8;
  optional<(anonymous_namespace)::cmSourceInfo> local_4d8;
  undefined1 local_450 [8];
  optional<(anonymous_namespace)::cmSourceInfo> info;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  undefined4 local_2d4;
  cmAlphaNum local_2d0;
  cmAlphaNum local_2a0;
  string local_270;
  string local_250 [32];
  string_view local_230;
  string local_220 [32];
  string_view local_200;
  string local_1f0 [32];
  string_view local_1d0;
  string local_1c0 [32];
  string_view local_1a0;
  string local_190 [32];
  string_view local_170;
  string local_160 [32];
  string_view local_140;
  reference local_130;
  string *arg;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin1;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_f8;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_e8;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range1;
  string arg_lang;
  string arg_ddi;
  string arg_obj;
  string arg_dep;
  string arg_pp;
  string arg_tdi;
  const_iterator argEnd_local;
  const_iterator argBeg_local;
  
  std::__cxx11::string::string((string *)(arg_pp.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(arg_dep.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(arg_obj.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(arg_ddi.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(arg_lang.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&__range1);
  local_f8 = cmMakeRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                       ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         )argBeg._M_current,
                        (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         )argEnd._M_current);
  local_e8 = &local_f8;
  __end1 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::begin(local_e8);
  arg = (string *)
        cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::end(local_e8);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&arg);
    if (!bVar1) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          uVar2 = std::__cxx11::string::empty();
          if ((uVar2 & 1) == 0) {
            uVar2 = std::__cxx11::string::empty();
            if ((uVar2 & 1) == 0) {
              uVar2 = std::__cxx11::string::empty();
              if ((uVar2 & 1) == 0) {
                uVar2 = std::__cxx11::string::empty();
                if ((uVar2 & 1) == 0) {
                  std::optional<(anonymous_namespace)::cmSourceInfo>::optional
                            ((optional<(anonymous_namespace)::cmSourceInfo> *)local_450);
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&__range1,"Fortran");
                  if (bVar1) {
                    anon_unknown.dwarf_69b3b7::cmcmd_cmake_ninja_depends_fortran
                              (&local_4d8,(string *)((long)&arg_pp.field_2 + 8),
                               (string *)((long)&arg_dep.field_2 + 8));
                    std::optional<(anonymous_namespace)::cmSourceInfo>::operator=
                              ((optional<(anonymous_namespace)::cmSourceInfo> *)local_450,&local_4d8
                              );
                    std::optional<(anonymous_namespace)::cmSourceInfo>::~optional(&local_4d8);
                    bVar1 = std::optional::operator_cast_to_bool((optional *)local_450);
                    if (bVar1) {
                      pcVar3 = std::optional<(anonymous_namespace)::cmSourceInfo>::operator->
                                         ((optional<(anonymous_namespace)::cmSourceInfo> *)local_450
                                         );
                      std::__cxx11::string::operator=
                                ((string *)pcVar3,(string *)(arg_ddi.field_2._M_local_buf + 8));
                      cmGeneratedFileStream::cmGeneratedFileStream
                                ((cmGeneratedFileStream *)local_7c0,
                                 (string *)((long)&arg_obj.field_2 + 8),false,None);
                      cmsys::SystemTools::ConvertToUnixOutputPath
                                ((string *)&__range1_1,(string *)((long)&arg_dep.field_2 + 8));
                      poVar4 = std::operator<<((ostream *)local_7c0,(string *)&__range1_1);
                      std::operator<<(poVar4,":");
                      std::__cxx11::string::~string((string *)&__range1_1);
                      pcVar3 = std::optional<(anonymous_namespace)::cmSourceInfo>::operator->
                                         ((optional<(anonymous_namespace)::cmSourceInfo> *)local_450
                                         );
                      __end1_1 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::begin(&pcVar3->Includes);
                      include = (string *)
                                std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::end(&pcVar3->Includes);
                      while( true ) {
                        bVar1 = __gnu_cxx::operator!=
                                          (&__end1_1,
                                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            *)&include);
                        if (!bVar1) break;
                        local_800 = __gnu_cxx::
                                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::operator*(&__end1_1);
                        poVar4 = std::operator<<((ostream *)local_7c0," \\\n ");
                        cmsys::SystemTools::ConvertToUnixOutputPath(&local_820,local_800);
                        std::operator<<(poVar4,(string *)&local_820);
                        std::__cxx11::string::~string((string *)&local_820);
                        __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator++(&__end1_1);
                      }
                      std::operator<<((ostream *)local_7c0,"\n");
                      cmGeneratedFileStream::~cmGeneratedFileStream
                                ((cmGeneratedFileStream *)local_7c0);
                      pcVar3 = std::optional<(anonymous_namespace)::cmSourceInfo>::operator->
                                         ((optional<(anonymous_namespace)::cmSourceInfo> *)local_450
                                         );
                      bVar1 = cmScanDepFormat_P1689_Write
                                        ((string *)((long)&arg_lang.field_2 + 8),&pcVar3->ScanDep);
                      if (bVar1) {
                        argBeg_local._M_current._4_4_ = 0;
                      }
                      else {
                        cmAlphaNum::cmAlphaNum(&local_870,"-E cmake_ninja_depends failed to write ")
                        ;
                        cmAlphaNum::cmAlphaNum(&local_8a0,(string *)((long)&arg_lang.field_2 + 8));
                        cmStrCat<>(&local_840,&local_870,&local_8a0);
                        cmSystemTools::Error(&local_840);
                        std::__cxx11::string::~string((string *)&local_840);
                        argBeg_local._M_current._4_4_ = 1;
                      }
                    }
                    else {
                      argBeg_local._M_current._4_4_ = 1;
                    }
                  }
                  else {
                    cmAlphaNum::cmAlphaNum
                              (&local_528,"-E cmake_ninja_depends does not understand the ");
                    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&depfile.field_0x260,(string *)&__range1);
                    cmStrCat<char[10]>(&local_4f8,&local_528,(cmAlphaNum *)&depfile.field_0x260,
                                       (char (*) [10])0xc00a5e);
                    cmSystemTools::Error(&local_4f8);
                    std::__cxx11::string::~string((string *)&local_4f8);
                    argBeg_local._M_current._4_4_ = 1;
                  }
                  local_2d4 = 1;
                  std::optional<(anonymous_namespace)::cmSourceInfo>::~optional
                            ((optional<(anonymous_namespace)::cmSourceInfo> *)local_450);
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_3c0,
                             "-E cmake_ninja_depends requires value for --lang=",
                             (allocator<char> *)
                             &info.
                              super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>
                              ._M_payload.
                              super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                              .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>.
                              field_0x87);
                  cmSystemTools::Error(&local_3c0);
                  std::__cxx11::string::~string((string *)&local_3c0);
                  std::allocator<char>::~allocator
                            ((allocator<char> *)
                             &info.
                              super__Optional_base<(anonymous_namespace)::cmSourceInfo,_false,_false>
                              ._M_payload.
                              super__Optional_payload<(anonymous_namespace)::cmSourceInfo,_true,_false,_false>
                              .super__Optional_payload_base<(anonymous_namespace)::cmSourceInfo>.
                              field_0x87);
                  argBeg_local._M_current._4_4_ = 1;
                  local_2d4 = 1;
                }
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_398,"-E cmake_ninja_depends requires value for --ddi=",
                           &local_399);
                cmSystemTools::Error(&local_398);
                std::__cxx11::string::~string((string *)&local_398);
                std::allocator<char>::~allocator(&local_399);
                argBeg_local._M_current._4_4_ = 1;
                local_2d4 = 1;
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_370,"-E cmake_ninja_depends requires value for --obj=",
                         &local_371);
              cmSystemTools::Error(&local_370);
              std::__cxx11::string::~string((string *)&local_370);
              std::allocator<char>::~allocator(&local_371);
              argBeg_local._M_current._4_4_ = 1;
              local_2d4 = 1;
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_348,"-E cmake_ninja_depends requires value for --dep=",
                       &local_349);
            cmSystemTools::Error(&local_348);
            std::__cxx11::string::~string((string *)&local_348);
            std::allocator<char>::~allocator(&local_349);
            argBeg_local._M_current._4_4_ = 1;
            local_2d4 = 1;
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_320,"-E cmake_ninja_depends requires value for --pp=",
                     &local_321);
          cmSystemTools::Error(&local_320);
          std::__cxx11::string::~string((string *)&local_320);
          std::allocator<char>::~allocator(&local_321);
          argBeg_local._M_current._4_4_ = 1;
          local_2d4 = 1;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f8,"-E cmake_ninja_depends requires value for --tdi=",
                   &local_2f9);
        cmSystemTools::Error(&local_2f8);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::allocator<char>::~allocator(&local_2f9);
        argBeg_local._M_current._4_4_ = 1;
        local_2d4 = 1;
      }
LAB_00396faf:
      std::__cxx11::string::~string((string *)&__range1);
      std::__cxx11::string::~string((string *)(arg_lang.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(arg_ddi.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(arg_obj.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(arg_dep.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(arg_pp.field_2._M_local_buf + 8));
      return argBeg_local._M_current._4_4_;
    }
    local_130 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    sVar5 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
    local_140 = sVar5;
    bVar1 = cmHasLiteralPrefix<7ul>(sVar5,(char (*) [7])0xbe0917);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)local_160,(ulong)local_130);
      std::__cxx11::string::operator=((string *)(arg_pp.field_2._M_local_buf + 8),local_160);
      std::__cxx11::string::~string(local_160);
    }
    else {
      sVar5 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
      local_170 = sVar5;
      bVar1 = cmHasLiteralPrefix<6ul>(sVar5,(char (*) [6])0xbdf04e);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)local_190,(ulong)local_130);
        std::__cxx11::string::operator=((string *)(arg_dep.field_2._M_local_buf + 8),local_190);
        std::__cxx11::string::~string(local_190);
      }
      else {
        sVar5 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
        local_1a0 = sVar5;
        bVar1 = cmHasLiteralPrefix<7ul>(sVar5,(char (*) [7])0xbdf07e);
        if (bVar1) {
          std::__cxx11::string::substr((ulong)local_1c0,(ulong)local_130);
          std::__cxx11::string::operator=((string *)(arg_obj.field_2._M_local_buf + 8),local_1c0);
          std::__cxx11::string::~string(local_1c0);
        }
        else {
          sVar5 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
          local_1d0 = sVar5;
          bVar1 = cmHasLiteralPrefix<7ul>(sVar5,(char (*) [7])0xbdf0af);
          if (bVar1) {
            std::__cxx11::string::substr((ulong)local_1f0,(ulong)local_130);
            std::__cxx11::string::operator=((string *)(arg_ddi.field_2._M_local_buf + 8),local_1f0);
            std::__cxx11::string::~string(local_1f0);
          }
          else {
            sVar5 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
            local_200 = sVar5;
            bVar1 = cmHasLiteralPrefix<7ul>(sVar5,(char (*) [7])0xbe0eca);
            if (bVar1) {
              std::__cxx11::string::substr((ulong)local_220,(ulong)local_130);
              std::__cxx11::string::operator=
                        ((string *)(arg_lang.field_2._M_local_buf + 8),local_220);
              std::__cxx11::string::~string(local_220);
            }
            else {
              sVar5 = (string_view)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
              local_230 = sVar5;
              bVar1 = cmHasLiteralPrefix<8ul>(sVar5,(char (*) [8])0xbdf832);
              if (!bVar1) {
                cmAlphaNum::cmAlphaNum(&local_2a0,"-E cmake_ninja_depends unknown argument: ");
                cmAlphaNum::cmAlphaNum(&local_2d0,local_130);
                cmStrCat<>(&local_270,&local_2a0,&local_2d0);
                cmSystemTools::Error(&local_270);
                std::__cxx11::string::~string((string *)&local_270);
                argBeg_local._M_current._4_4_ = 1;
                local_2d4 = 1;
                goto LAB_00396faf;
              }
              std::__cxx11::string::substr((ulong)local_250,(ulong)local_130);
              std::__cxx11::string::operator=((string *)&__range1,local_250);
              std::__cxx11::string::~string(local_250);
            }
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

int cmcmd_cmake_ninja_depends(std::vector<std::string>::const_iterator argBeg,
                              std::vector<std::string>::const_iterator argEnd)
{
  std::string arg_tdi;
  std::string arg_pp;
  std::string arg_dep;
  std::string arg_obj;
  std::string arg_ddi;
  std::string arg_lang;
  for (std::string const& arg : cmMakeRange(argBeg, argEnd)) {
    if (cmHasLiteralPrefix(arg, "--tdi=")) {
      arg_tdi = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--pp=")) {
      arg_pp = arg.substr(5);
    } else if (cmHasLiteralPrefix(arg, "--dep=")) {
      arg_dep = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--obj=")) {
      arg_obj = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--ddi=")) {
      arg_ddi = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--lang=")) {
      arg_lang = arg.substr(7);
    } else {
      cmSystemTools::Error(
        cmStrCat("-E cmake_ninja_depends unknown argument: ", arg));
      return 1;
    }
  }
  if (arg_tdi.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --tdi=");
    return 1;
  }
  if (arg_pp.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --pp=");
    return 1;
  }
  if (arg_dep.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --dep=");
    return 1;
  }
  if (arg_obj.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --obj=");
    return 1;
  }
  if (arg_ddi.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --ddi=");
    return 1;
  }
  if (arg_lang.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --lang=");
    return 1;
  }

  cm::optional<cmSourceInfo> info;
  if (arg_lang == "Fortran") {
    info = cmcmd_cmake_ninja_depends_fortran(arg_tdi, arg_pp);
  } else {
    cmSystemTools::Error(
      cmStrCat("-E cmake_ninja_depends does not understand the ", arg_lang,
               " language"));
    return 1;
  }

  if (!info) {
    // The error message is already expected to have been output.
    return 1;
  }

  info->ScanDep.PrimaryOutput = arg_obj;

  {
    cmGeneratedFileStream depfile(arg_dep);
    depfile << cmSystemTools::ConvertToUnixOutputPath(arg_pp) << ":";
    for (std::string const& include : info->Includes) {
      depfile << " \\\n " << cmSystemTools::ConvertToUnixOutputPath(include);
    }
    depfile << "\n";
  }

  if (!cmScanDepFormat_P1689_Write(arg_ddi, info->ScanDep)) {
    cmSystemTools::Error(
      cmStrCat("-E cmake_ninja_depends failed to write ", arg_ddi));
    return 1;
  }
  return 0;
}